

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::addImageProcessing2QCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,bool isForGather)

{
  Instruction *pIVar1;
  undefined7 in_register_00000011;
  anon_class_8_1_8991fb9c addDecor;
  anon_class_8_1_8991fb9c local_20;
  
  if ((int)CONCAT71(in_register_00000011,isForGather) != 0) {
    addImageProcessingQCOMDecoration(this,id,BlockMatchTextureQCOM);
    return;
  }
  pIVar1 = (this->builder).module.idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[id];
  local_20.this = this;
  if (pIVar1->opCode == OpSampledImage) {
    if ((**(byte **)&(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) != 0) {
      addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
                (&local_20,
                 *(pIVar1->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start,BlockMatchTextureQCOM);
      pIVar1 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[id];
      if ((**(byte **)&(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data & 2) != 0) {
        id = *(Id *)(*(long *)&(pIVar1->operands).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 4);
        goto LAB_00451f01;
      }
    }
    __assert_fail("idOperand[op]",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
  }
  addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
            (&local_20,id,BlockMatchTextureQCOM);
LAB_00451f01:
  addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
            (&local_20,id,BlockMatchSamplerQCOM);
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessing2QCOMDecoration(spv::Id id, bool isForGather)
{
  if (isForGather) {
    return addImageProcessingQCOMDecoration(id, spv::DecorationBlockMatchTextureQCOM);
  }

  auto addDecor =
    [this](spv::Id id, spv::Decoration decor) {
      spv::Id tsopc = this->builder.getOpCode(id);
      if (tsopc == spv::OpLoad) {
        spv::Id tsid = this->builder.getIdOperand(id, 0);
        if (this->glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4) {
          assert(iOSet.count(tsid) > 0);
        }
        if (!hasQCOMImageProceessingDecoration(tsid, decor)) {
          this->builder.addDecoration(tsid, decor);
          idToQCOMDecorations[tsid].push_back(decor);
        }
      }
    };

  spv::Id opc = builder.getOpCode(id);
  bool isInterfaceObject = (opc != spv::OpSampledImage);

  if (!isInterfaceObject) {
    addDecor(builder.getIdOperand(id, 0), spv::DecorationBlockMatchTextureQCOM);
    addDecor(builder.getIdOperand(id, 1), spv::DecorationBlockMatchSamplerQCOM);
  } else {
    addDecor(id, spv::DecorationBlockMatchTextureQCOM);
    addDecor(id, spv::DecorationBlockMatchSamplerQCOM);
  }
}